

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

bool wasm::DataFlow::allInputsConstant(Node *node)

{
  bool bVar1;
  size_type sVar2;
  Node *pNVar3;
  bool local_22;
  bool local_21;
  uint local_1c;
  Index i;
  Node *node_local;
  
  if (node->type == Expr) {
    bVar1 = Expression::is<wasm::Unary>((node->field_1).expr);
    if (bVar1) {
      pNVar3 = Node::getValue(node,0);
      bVar1 = Node::isConst(pNVar3);
      return bVar1;
    }
    bVar1 = Expression::is<wasm::Binary>((node->field_1).expr);
    if (bVar1) {
      pNVar3 = Node::getValue(node,0);
      bVar1 = Node::isConst(pNVar3);
      local_21 = false;
      if (bVar1) {
        pNVar3 = Node::getValue(node,1);
        local_21 = Node::isConst(pNVar3);
      }
      return local_21;
    }
    bVar1 = Expression::is<wasm::Select>((node->field_1).expr);
    if (bVar1) {
      pNVar3 = Node::getValue(node,0);
      bVar1 = Node::isConst(pNVar3);
      local_22 = false;
      if (bVar1) {
        pNVar3 = Node::getValue(node,1);
        bVar1 = Node::isConst(pNVar3);
        local_22 = false;
        if (bVar1) {
          pNVar3 = Node::getValue(node,2);
          local_22 = Node::isConst(pNVar3);
        }
      }
      return local_22;
    }
  }
  else if (node->type == Phi) {
    local_1c = 1;
    while( true ) {
      sVar2 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::size
                        (&node->values);
      if (sVar2 <= local_1c) {
        return true;
      }
      pNVar3 = Node::getValue(node,local_1c);
      bVar1 = Node::isConst(pNVar3);
      if (!bVar1) break;
      local_1c = local_1c + 1;
    }
    return false;
  }
  return false;
}

Assistant:

inline bool allInputsConstant(Node* node) {
  switch (node->type) {
    case Node::Type::Expr: {
      if (node->expr->is<Unary>()) {
        return node->getValue(0)->isConst();
      } else if (node->expr->is<Binary>()) {
        return node->getValue(0)->isConst() && node->getValue(1)->isConst();
      } else if (node->expr->is<Select>()) {
        return node->getValue(0)->isConst() && node->getValue(1)->isConst() &&
               node->getValue(2)->isConst();
      }
      break;
    }
    case Node::Type::Phi: {
      // Check if any of the others are not equal
      for (Index i = 1; i < node->values.size(); i++) {
        if (!node->getValue(i)->isConst()) {
          return false;
        }
      }
      return true;
    }
    default: {}
  }
  return false;
}